

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O2

void __thiscall
Database_GetLocationOverflows_Test::Database_GetLocationOverflows_Test
          (Database_GetLocationOverflows_Test *this)

{
  anon_unknown.dwarf_59778::Database::Database(&this->super_Database);
  (this->super_Database).super_Test._vptr_Test = (_func_int **)&PTR__Database_00253e68;
  return;
}

Assistant:

TEST_F (Database, GetLocationOverflows) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    auto const addr = std::numeric_limits<pstore::address>::max ();
    PSTORE_STATIC_ASSERT (std::numeric_limits<std::size_t>::max () >=
                          std::numeric_limits<std::uint64_t>::max ());
    std::size_t const size = std::numeric_limits<std::uint64_t>::max () - addr.absolute () + 1U;
    ASSERT_TRUE (addr + size < addr); // This addition is attended to overflow.
    check_for_error ([&db, addr, size] () { db.getro (addr, size); },
                     pstore::error_code::bad_address);
    check_for_error ([&db, addr, size] () { db.getrou (addr, size); },
                     pstore::error_code::bad_address);
}